

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_ThrowGrenade
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  AActor *this;
  undefined8 *puVar6;
  void *pvVar7;
  PClassActor *type;
  AWeapon *this_00;
  double dVar8;
  double dVar9;
  double dVar10;
  PClass *pPVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  undefined8 uVar15;
  PClass *pPVar16;
  AActor *missile;
  VMValue *pVVar17;
  PClassActor *pPVar18;
  char *pcVar19;
  TArray<VMValue,_VMValue> *unaff_R12;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  DVector3 local_48;
  
  pPVar11 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003d1ccd:
    pcVar19 = "(paramnum) < numparam";
LAB_003d1d26:
    __assert_fail(pcVar19,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003d1cc4:
    pcVar19 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d1d26;
  }
  this = (AActor *)(param->field_0).field_1.a;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar13 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar13);
      unaff_R12 = defaultparam;
    }
    pPVar16 = (this->super_DThinker).super_DObject.Class;
    bVar20 = pPVar16 != (PClass *)0x0;
    if (pPVar16 != pPVar11 && bVar20) {
      do {
        pPVar16 = pPVar16->ParentClass;
        bVar20 = pPVar16 != (PClass *)0x0;
        if (pPVar16 == pPVar11) break;
      } while (pPVar16 != (PClass *)0x0);
    }
    if (!bVar20) {
      pcVar19 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d1d26;
    }
  }
  pPVar11 = AActor::RegistrationInfo.MyClass;
  iVar13 = (int)unaff_R12;
  if (numparam == 1) goto LAB_003d1ccd;
  if ((param[1].field_0.field_3.Type != '\x03') ||
     ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
  goto LAB_003d1cc4;
  puVar6 = (undefined8 *)param[1].field_0.field_1.a;
  if (puVar6 != (undefined8 *)0x0) {
    if (puVar6[1] == 0) {
      uVar15 = (**(code **)*puVar6)(puVar6);
      puVar6[1] = uVar15;
      unaff_R12 = defaultparam;
    }
    iVar13 = (int)unaff_R12;
    pPVar16 = (PClass *)puVar6[1];
    bVar20 = pPVar16 != (PClass *)0x0;
    if (pPVar16 != pPVar11 && bVar20) {
      do {
        pPVar16 = pPVar16->ParentClass;
        bVar20 = pPVar16 != (PClass *)0x0;
        if (pPVar16 == pPVar11) break;
      } while (pPVar16 != (PClass *)0x0);
    }
    if (!bVar20) {
      pcVar19 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d1d26;
    }
  }
  if (numparam < 3) goto LAB_003d1ccd;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar19 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003d1d26;
  }
  if (numparam == 3) {
    pcVar19 = "(paramnum) < numparam";
LAB_003d1dc1:
    __assert_fail(pcVar19,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb4,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param[3].field_0.field_3.Type != '\x03') ||
     ((pvVar7 = param[2].field_0.field_1.a, param[3].field_0.field_1.atag != 1 &&
      (param[3].field_0.field_1.a != (void *)0x0)))) {
    pcVar19 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d1dc1;
  }
  type = (PClassActor *)param[3].field_0.field_1.a;
  if ((type != (PClassActor *)0x0) &&
     (pPVar18 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
    do {
      pPVar18 = (PClassActor *)(pPVar18->super_PClass).ParentClass;
      if (pPVar18 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
    } while (pPVar18 != (PClassActor *)0x0);
    if (pPVar18 == (PClassActor *)0x0) {
      pcVar19 = "missile == NULL || missile->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d1dc1;
    }
  }
  if (numparam < 5) {
    pVVar17 = defaultparam->Array;
    if (pVVar17[4].field_0.field_3.Type != '\x01') {
      pcVar19 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d1d45;
    }
  }
  else {
    pVVar17 = param;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar19 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d1d45:
      __assert_fail(pcVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb5,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar1 = pVVar17[4].field_0.f;
  if (numparam < 6) {
    pVVar17 = defaultparam->Array;
    if (pVVar17[5].field_0.field_3.Type != '\x01') {
      pcVar19 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d1d64;
    }
  }
  else {
    pVVar17 = param;
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar19 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d1d64:
      __assert_fail(pcVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb6,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar2 = pVVar17[5].field_0.f;
  if (numparam < 7) {
    pVVar17 = defaultparam->Array;
    if (pVVar17[6].field_0.field_3.Type != '\x01') {
      pcVar19 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d1d83;
    }
  }
  else {
    pVVar17 = param;
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar19 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d1d83:
      __assert_fail(pcVar19,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,2999,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar3 = pVVar17[6].field_0.f;
  if (numparam < 8) {
    param = defaultparam->Array;
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar19 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d1da2;
    }
  }
  else if (param[7].field_0.field_3.Type != '\0') {
    pcVar19 = "(param[paramnum]).Type == REGT_INT";
LAB_003d1da2:
    __assert_fail(pcVar19,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,3000,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (type == (PClassActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbbc,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003d1c83:
    uVar21 = 1;
  }
  else {
    if ((pvVar7 != (void *)0x0 && this->player != (player_t *)0x0) &&
       (*(int *)((long)pvVar7 + 8) == 1)) {
      this_00 = this->player->ReadyWeapon;
      if (this_00 == (AWeapon *)0x0) {
        if (0 < numret) {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0xbc5,
                          "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          goto LAB_003d19bb;
        }
LAB_003d19db:
        bVar20 = false;
        iVar13 = 0;
      }
      else {
        bVar20 = true;
        if ((param[7].field_0.i != 0) &&
           (bVar12 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1), !bVar12)) {
          if (numret < 1) goto LAB_003d19db;
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0xbc9,
                          "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
LAB_003d19bb:
          if (ret->RegType != '\0') goto LAB_003d1cf7;
          *(undefined4 *)ret->Location = 1;
          iVar13 = 1;
          bVar20 = false;
        }
      }
      if (!bVar20) {
        return iVar13;
      }
    }
    dVar4 = this->Floorclip;
    dVar8 = AActor::GetBobOffset(this,0.0);
    uVar21 = 0;
    uVar22 = 0;
    if (this->player != (player_t *)0x0) {
      dVar5 = this->player->crouchoffset;
      uVar21 = SUB84(dVar5,0);
      uVar22 = (undefined4)((ulong)dVar5 >> 0x20);
    }
    local_48.Z = dVar1 + (dVar8 - dVar4) + 35.0 + (double)CONCAT44(uVar22,uVar21) + (this->__Pos).Z;
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    missile = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
    if (missile != (AActor *)0x0) {
      P_PlaySpawnSound(missile,this);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        missile->Speed = dVar2;
      }
      uVar14 = FRandom::GenRand32(&pr_grenade);
      dVar2 = (double)(int)((uVar14 & 7) - 4) * 1.40625 + (this->Angles).Yaw.Degrees;
      (missile->Angles).Yaw.Degrees = dVar2;
      dVar1 = missile->Speed;
      dVar4 = FFastTrig::cos(&fasttrig,(this->Angles).Pitch.Degrees * 11930464.711111112);
      dVar4 = dVar4 * dVar1;
      dVar1 = missile->Speed;
      dVar8 = FFastTrig::sin(&fasttrig,dVar1);
      dVar2 = FFastTrig::cos(&fasttrig,dVar2 * 11930464.711111112 + 6755399441055744.0);
      dVar2 = dVar2 * dVar4;
      dVar5 = FFastTrig::sin(&fasttrig,dVar2);
      dVar9 = FFastTrig::sin(&fasttrig,
                             (this->Angles).Pitch.Degrees * 11930464.711111112 + 6755399441055744.0)
      ;
      dVar9 = dVar9 * dVar3;
      dVar10 = FFastTrig::cos(&fasttrig,dVar9);
      dVar1 = dVar10 * dVar3 + dVar8 * dVar1;
      dVar3 = FFastTrig::cos(&fasttrig,dVar1);
      dVar2 = dVar3 * dVar9 + dVar2;
      dVar3 = FFastTrig::sin(&fasttrig,dVar2);
      (missile->Vel).X = (this->Vel).X * 0.5 + dVar2;
      (missile->Vel).Y = (this->Vel).Y * 0.5 + dVar3 * dVar9 + dVar5 * dVar4;
      (missile->Vel).Z = dVar1;
      (missile->target).field_0.p = this;
      P_CheckMissileSpawn(missile,this->radius);
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbf6,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003d1c83;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbf4,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar21 = 0;
  }
  if (ret->RegType == '\0') {
    *(undefined4 *)ret->Location = uVar21;
    return 1;
  }
LAB_003d1cf7:
  __assert_fail("RegType == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                ,0x13f,"void VMReturn::SetInt(int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrowGrenade)
{
		PARAM_ACTION_PROLOGUE(AActor);
	PARAM_CLASS		(missile, AActor);
		PARAM_FLOAT_DEF	(zheight)	
		PARAM_FLOAT_DEF	(xyvel)		
		PARAM_FLOAT_DEF	(zvel)		
		PARAM_BOOL_DEF	(useammo)	

	if (missile == NULL)
	{
		ACTION_RETURN_BOOL(true);
	}
	if (ACTION_CALL_FROM_PSPRITE())
	{
		// Used from a weapon, so use some ammo
		AWeapon *weapon = self->player->ReadyWeapon;

		if (weapon == NULL)
		{
			ACTION_RETURN_BOOL(true);
		}
		if (useammo && !weapon->DepleteAmmo(weapon->bAltFire))
		{
			ACTION_RETURN_BOOL(true);
		}
	}

	AActor *bo;

	bo = Spawn(missile, 
			self->PosPlusZ(-self->Floorclip + self->GetBobOffset() + zheight + 35 + (self->player? self->player->crouchoffset : 0.)),
			ALLOW_REPLACE);
	if (bo)
	{
		P_PlaySpawnSound(bo, self);
		if (xyvel != 0)
			bo->Speed = xyvel;
		bo->Angles.Yaw = self->Angles.Yaw + (((pr_grenade()&7) - 4) * (360./256.));

		DAngle pitch = -self->Angles.Pitch;
		DAngle angle = bo->Angles.Yaw;

		// There are two vectors we are concerned about here: xy and z. We rotate
		// them separately according to the shooter's pitch and then sum them to
		// get the final velocity vector to shoot with.

		double xy_xyscale = bo->Speed * pitch.Cos();
		double xy_velz = bo->Speed * pitch.Sin();
		double xy_velx = xy_xyscale * angle.Cos();
		double xy_vely = xy_xyscale * angle.Sin();

		pitch = self->Angles.Pitch;
		double z_xyscale = zvel * pitch.Sin();
		double z_velz = zvel * pitch.Cos();
		double z_velx = z_xyscale * angle.Cos();
		double z_vely = z_xyscale * angle.Sin();

		bo->Vel.X = xy_velx + z_velx + self->Vel.X / 2;
		bo->Vel.Y = xy_vely + z_vely + self->Vel.Y / 2;
		bo->Vel.Z = xy_velz + z_velz;

		bo->target = self;
		P_CheckMissileSpawn (bo, self->radius);
	} 
	else
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}